

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

UINT16 TPML_CCA_Marshal(TPML_CCA *source,BYTE **buffer,INT32 *size)

{
  UINT32 UVar1;
  UINT16 UVar2;
  long lVar3;
  TPMA_CC *source_00;
  
  UINT32_Marshal(&source->count,buffer,size);
  UVar1 = source->count;
  lVar3 = (long)(int)UVar1;
  if (lVar3 < 1) {
    UVar2 = 4;
  }
  else {
    source_00 = source->commandAttributes;
    do {
      UINT32_Marshal((UINT32 *)source_00,buffer,size);
      source_00 = source_00 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    UVar2 = (short)UVar1 * 4 + 4;
  }
  return UVar2;
}

Assistant:

UINT16
TPML_CCA_Marshal(TPML_CCA *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + UINT32_Marshal((UINT32 *)&(source->count), buffer, size));
    result = (UINT16)(result + TPMA_CC_Array_Marshal((TPMA_CC *)(source->commandAttributes), buffer, size, (INT32)(source->count)));
    return result;
}